

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::force(Solver *this,ImpliedLiteral *p)

{
  uint uVar1;
  uint uVar2;
  Literal p_00;
  bool bVar3;
  uint32 uVar4;
  ulong uVar5;
  pointer pIVar6;
  
  uVar1 = (p->lit).rep_;
  uVar2 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
  if ((byte)((byte)uVar2 & 3) == (byte)(2U - ((uVar1 & 2) == 0))) {
    if (uVar2 >> 4 <= p->level) {
      return true;
    }
    uVar5 = (ulong)(this->impliedLits_).lits.ebo_.size;
    if (uVar5 != 0) {
      pIVar6 = (this->impliedLits_).lits.ebo_.buf;
      do {
        if (((pIVar6->lit).rep_ ^ uVar1) < 2) goto LAB_0016a690;
        pIVar6 = pIVar6 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    pIVar6 = (pointer)0x0;
LAB_0016a690:
    if (pIVar6 != (pointer)0x0) {
      if (p->level < pIVar6->level) {
        uVar4 = p->level;
        pIVar6->lit = (Literal)(p->lit).rep_;
        pIVar6->level = uVar4;
        (pIVar6->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ =
             (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_;
        (pIVar6->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second =
             (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second;
        setReason(this,(Literal)(p->lit).rep_,(Antecedent *)&p->ante,
                  (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second);
      }
      if (pIVar6 != (pointer)0x0) {
        return true;
      }
    }
  }
  uVar4 = undoUntilImpl(this,p->level,false);
  if (uVar4 != p->level) {
    uVar1 = (this->levels_).super_type.ebo_.size;
    if ((this->impliedLits_).level < uVar1) {
      (this->impliedLits_).level = uVar1;
    }
    bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::push_back
              (&(this->impliedLits_).lits,p);
  }
  p_00.rep_ = (p->lit).rep_;
  if (((byte)(*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p_00.rep_ & 0xfffffffc)) &
             3) == (byte)(2U - ((p_00.rep_ & 2) == 0))) &&
     (bVar3 = setReason(this,p_00,(Antecedent *)&p->ante,
                        (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second), bVar3)) {
    return true;
  }
  bVar3 = force(this,&p->lit,(Antecedent *)&p->ante,
                (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second);
  return bVar3;
}

Assistant:

bool Solver::force(const ImpliedLiteral& p) {
	// Already implied?
	if (isTrue(p.lit)) {
		if (level(p.lit.var()) <= p.level) { return true; }
		if (ImpliedLiteral* x = impliedLits_.find(p.lit)) {
			if (x->level > p.level) {
				*x = p;
				setReason(p.lit, p.ante.ante(), p.ante.data());
			}
			return true;
		}
	}
	if (undoUntil(p.level) != p.level) {
		// Logically the implication is on level p.level.
		// Store enough information so that p can be re-assigned once we backtrack.
		impliedLits_.add(decisionLevel(), p);
	}
	return (isTrue(p.lit) && setReason(p.lit, p.ante.ante(), p.ante.data())) || force(p.lit, p.ante.ante(), p.ante.data());
}